

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2StartElement(void *ctx,xmlChar *fullname,xmlChar **atts)

{
  xmlDocPtr doc;
  _xmlNode *p_Var1;
  xmlDtdPtr dtd;
  _xmlDtd *p_Var2;
  int iVar3;
  uint uVar4;
  xmlNodePtr pxVar5;
  _xmlNode *attr;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  xmlAttributePtr pxVar8;
  xmlNsPtr *str2;
  xmlAttributePtr pxVar9;
  xmlChar **ppxVar10;
  bool bVar11;
  xmlChar *local_a8;
  uint local_9c;
  xmlValidCtxtPtr local_98;
  xmlChar *local_90;
  xmlChar **local_88;
  xmlChar *local_80;
  xmlNodePtr local_78;
  xmlNodePtr local_70;
  xmlNsPtr ns;
  
  if ((fullname != (xmlChar *)0x0 && ctx != (void *)0x0) &&
     (doc = *(xmlDocPtr *)((long)ctx + 0x10), doc != (xmlDocPtr)0x0)) {
    if (*(int *)((long)ctx + 0x34) == 0) {
      if (((*(int *)((long)ctx + 0x9c) != 0) && (doc->extSubset == (_xmlDtd *)0x0)) &&
         ((p_Var2 = doc->intSubset, p_Var2 == (_xmlDtd *)0x0 ||
          ((((p_Var2->notations == (void *)0x0 && (p_Var2->elements == (void *)0x0)) &&
            (p_Var2->attributes == (void *)0x0)) && (p_Var2->entities == (void *)0x0)))))) {
        xmlCtxtErr((xmlParserCtxtPtr)ctx,(xmlNodePtr)0x0,XML_FROM_DTD,XML_ERR_NO_DTD,XML_ERR_ERROR,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,
                   "Validation failed: no DTD found !",0,0);
        *(undefined8 *)((long)ctx + 0x98) = 0;
      }
      pxVar7 = xmlSplitQName4(fullname,&local_a8);
      if (pxVar7 != (xmlChar *)0x0) {
        local_90 = pxVar7;
        pxVar5 = xmlNewDocNode(*(xmlDocPtr *)((long)ctx + 0x10),(xmlNsPtr)0x0,pxVar7,(xmlChar *)0x0)
        ;
        if (pxVar5 != (xmlNodePtr)0x0) {
          *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
          local_70 = *(xmlNodePtr *)((long)ctx + 0x50);
          if (local_70 == (xmlNodePtr)0x0) {
            local_70 = *(xmlNodePtr *)((long)ctx + 0x10);
          }
          xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,pxVar5);
          iVar3 = nodePush((xmlParserCtxtPtr)ctx,pxVar5);
          pxVar6 = local_90;
          pxVar7 = local_a8;
          if (iVar3 < 0) {
            xmlUnlinkNode(pxVar5);
            xmlFreeNode(pxVar5);
          }
          else {
            dtd = *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50);
            local_78 = pxVar5;
            if ((dtd != (xmlDtdPtr)0x0) || (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) != 0)) {
              local_98 = (xmlValidCtxtPtr)xmlGetDtdQElementDesc(dtd,local_90,local_a8);
              bVar11 = local_98 == (xmlValidCtxtPtr)0x0;
              if (bVar11) {
                local_98 = (xmlValidCtxtPtr)
                           xmlGetDtdQElementDesc
                                     (*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),pxVar6,
                                      pxVar7);
              }
              local_9c = (uint)!bVar11;
              local_88 = atts + 2;
              local_80 = pxVar7;
              do {
                if (local_98 == (xmlValidCtxtPtr)0x0) break;
                if (((*(int *)(*(long *)((long)ctx + 0x10) + 0x4c) == 1) &&
                    (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) != 0)) &&
                   (*(int *)((long)ctx + 0x9c) != 0)) {
                  for (pxVar9 = (xmlAttributePtr)local_98->vstateTab; pxVar9 != (xmlAttributePtr)0x0
                      ; pxVar9 = pxVar9->nexth) {
                    if (((pxVar9->defaultValue != (xmlChar *)0x0) &&
                        (pxVar8 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)
                                                      (*(long *)((long)ctx + 0x10) + 0x58),
                                                     pxVar9->elem,pxVar9->name,pxVar9->prefix),
                        pxVar8 == pxVar9)) &&
                       (pxVar8 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)
                                                     (*(long *)((long)ctx + 0x10) + 0x50),
                                                    pxVar9->elem,pxVar9->name,pxVar9->prefix),
                       pxVar8 == (xmlAttributePtr)0x0)) {
                      if (pxVar9->prefix == (xmlChar *)0x0) {
                        pxVar7 = xmlStrdup(pxVar9->name);
                      }
                      else {
                        pxVar7 = xmlStrdup(pxVar9->prefix);
                        if (pxVar7 == (xmlChar *)0x0) {
                          pxVar7 = (xmlChar *)0x0;
                        }
                        else {
                          pxVar7 = xmlStrcat(pxVar7,":");
                        }
                        if (pxVar7 == (xmlChar *)0x0) {
                          pxVar7 = (xmlChar *)0x0;
                        }
                        else {
                          pxVar7 = xmlStrcat(pxVar7,pxVar9->name);
                        }
                      }
                      if (pxVar7 == (xmlChar *)0x0) {
                        xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
                      }
                      else {
                        if (atts != (xmlChar **)0x0) {
                          pxVar6 = *atts;
                          ppxVar10 = local_88;
                          while (pxVar6 != (xmlChar *)0x0) {
                            iVar3 = xmlStrEqual(pxVar6,pxVar7);
                            if (iVar3 != 0) goto LAB_001480d3;
                            pxVar6 = *ppxVar10;
                            ppxVar10 = ppxVar10 + 2;
                          }
                        }
                        xmlCtxtErr((xmlParserCtxtPtr)ctx,(xmlNodePtr)0x0,XML_FROM_DTD,
                                   XML_DTD_STANDALONE_DEFAULTED,XML_ERR_ERROR,pxVar7,pxVar9->elem,
                                   (xmlChar *)0x0,0,
                                   "standalone: attribute %s on %s defaulted from external subset\n"
                                   ,pxVar7,pxVar9->elem);
                        *(undefined4 *)((long)ctx + 0x98) = 0;
LAB_001480d3:
                        (*xmlFree)(pxVar7);
                      }
                      if (pxVar7 == (xmlChar *)0x0) break;
                    }
                  }
                }
                for (pxVar9 = (xmlAttributePtr)local_98->vstateTab; pxVar9 != (xmlAttributePtr)0x0;
                    pxVar9 = pxVar9->nexth) {
                  if (((pxVar9->defaultValue != (xmlChar *)0x0) &&
                      ((((pxVar9->prefix != (xmlChar *)0x0 &&
                         (iVar3 = xmlStrEqual(pxVar9->prefix,"xmlns"), iVar3 != 0)) ||
                        ((pxVar9->prefix == (xmlChar *)0x0 &&
                         (iVar3 = xmlStrEqual(pxVar9->name,"xmlns"), iVar3 != 0)))) ||
                       ((*(byte *)((long)ctx + 0x1b0) & 4) != 0)))) &&
                     (pxVar8 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50)
                                                  ,pxVar9->elem,pxVar9->name,pxVar9->prefix),
                     pxVar8 == pxVar9 || pxVar8 == (xmlAttributePtr)0x0)) {
                    str2 = (xmlNsPtr *)
                           xmlBuildQName(pxVar9->name,pxVar9->prefix,(xmlChar *)&ns,0x32);
                    if (str2 == (xmlNsPtr *)0x0) {
                      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
                    }
                    else {
                      if (atts != (xmlChar **)0x0) {
                        pxVar7 = *atts;
                        ppxVar10 = local_88;
                        while (pxVar7 != (xmlChar *)0x0) {
                          iVar3 = xmlStrEqual(pxVar7,(xmlChar *)str2);
                          if (iVar3 != 0) goto LAB_001481e7;
                          pxVar7 = *ppxVar10;
                          ppxVar10 = ppxVar10 + 2;
                        }
                      }
                      xmlSAX1Attribute((xmlParserCtxtPtr)ctx,(xmlChar *)str2,pxVar9->defaultValue,
                                       local_80);
LAB_001481e7:
                      if ((str2 != &ns) && (str2 != (xmlNsPtr *)pxVar9->name)) {
                        (*xmlFree)(str2);
                      }
                    }
                    if (str2 == (xmlNsPtr *)0x0) {
                      bVar11 = false;
                      goto LAB_0014824c;
                    }
                  }
                }
                bVar11 = local_9c == 1;
                if (bVar11) {
                  local_98 = (xmlValidCtxtPtr)
                             xmlGetDtdQElementDesc
                                       (*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),local_90,
                                        local_80);
                }
                local_9c = 0;
LAB_0014824c:
              } while (bVar11);
            }
            if (atts != (xmlChar **)0x0) {
              pxVar7 = *atts;
              pxVar6 = atts[1];
              if (pxVar6 != (xmlChar *)0x0 && pxVar7 != (xmlChar *)0x0) {
                ppxVar10 = atts + 3;
                do {
                  if ((((*pxVar7 == 'x') && (pxVar7[1] == 'm')) && (pxVar7[2] == 'l')) &&
                     ((pxVar7[3] == 'n' && (pxVar7[4] == 's')))) {
                    xmlSAX1Attribute((xmlParserCtxtPtr)ctx,pxVar7,pxVar6,local_a8);
                  }
                  pxVar7 = ppxVar10[-1];
                  if (pxVar7 == (xmlChar *)0x0) break;
                  pxVar6 = *ppxVar10;
                  ppxVar10 = ppxVar10 + 2;
                } while (pxVar6 != (xmlChar *)0x0);
              }
            }
            pxVar5 = local_78;
            iVar3 = xmlSearchNsSafe(local_78,local_a8,&ns);
            if (iVar3 < 0) {
              xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
            }
            if ((local_70 != (xmlNodePtr)0x0 && ns == (xmlNsPtr)0x0) &&
               (iVar3 = xmlSearchNsSafe(local_70,local_a8,&ns), iVar3 < 0)) {
              xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
            }
            if ((local_a8 != (xmlChar *)0x0) && (ns == (xmlNsPtr)0x0)) {
              xmlCtxtErr((xmlParserCtxtPtr)ctx,(xmlNodePtr)0x0,XML_FROM_NAMESPACE,
                         XML_NS_ERR_UNDEFINED_NAMESPACE,XML_ERR_WARNING,local_a8,(xmlChar *)0x0,
                         (xmlChar *)0x0,0,"Namespace prefix %s is not defined\n",local_a8,0);
              ns = xmlNewNs(pxVar5,(xmlChar *)0x0,local_a8);
              if (ns == (xmlNsPtr)0x0) {
                xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
              }
            }
            if (((ns != (xmlNsPtr)0x0) && (ns->href != (xmlChar *)0x0)) &&
               ((*ns->href != '\0' || (ns->prefix != (xmlChar *)0x0)))) {
              xmlSetNs(pxVar5,ns);
            }
            if (atts != (xmlChar **)0x0) {
              pxVar7 = *atts;
              pxVar6 = atts[1];
              if (pxVar6 != (xmlChar *)0x0 && pxVar7 != (xmlChar *)0x0) {
                ppxVar10 = atts + 3;
                do {
                  if ((((*pxVar7 != 'x') || (pxVar7[1] != 'm')) || (pxVar7[2] != 'l')) ||
                     ((pxVar7[3] != 'n' || (pxVar7[4] != 's')))) {
                    xmlSAX1Attribute((xmlParserCtxtPtr)ctx,pxVar7,pxVar6,(xmlChar *)0x0);
                  }
                  pxVar7 = ppxVar10[-1];
                  if (pxVar7 == (xmlChar *)0x0) break;
                  pxVar6 = *ppxVar10;
                  ppxVar10 = ppxVar10 + 2;
                } while (pxVar6 != (xmlChar *)0x0);
              }
            }
            if ((*(int *)((long)ctx + 0x9c) != 0) && ((*(byte *)((long)ctx + 0xd0) & 1) == 0)) {
              iVar3 = xmlValidateDtdFinal((xmlValidCtxtPtr)((long)ctx + 0xa0),
                                          *(xmlDocPtr *)((long)ctx + 0x10));
              if (iVar3 < 1) {
                *(undefined4 *)((long)ctx + 0x98) = 0;
              }
              if (iVar3 < 0) {
                *(undefined4 *)((long)ctx + 0x18) = 0;
              }
              uVar4 = xmlValidateRoot((xmlValidCtxtPtr)((long)ctx + 0xa0),
                                      *(xmlDocPtr *)((long)ctx + 0x10));
              *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar4;
              *(byte *)((long)ctx + 0xd0) = *(byte *)((long)ctx + 0xd0) | 1;
            }
          }
          if (local_a8 == (xmlChar *)0x0) {
            return;
          }
          (*xmlFree)(local_a8);
          return;
        }
        (*xmlFree)(local_a8);
      }
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
    }
    else {
      pxVar5 = xmlNewDocNode(doc,(xmlNsPtr)0x0,fullname,(xmlChar *)0x0);
      if (pxVar5 == (xmlNodePtr)0x0) {
        xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
        return;
      }
      *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
      xmlSAX2AppendChild((xmlParserCtxtPtr)ctx,pxVar5);
      iVar3 = nodePush((xmlParserCtxtPtr)ctx,pxVar5);
      if (iVar3 < 0) {
        xmlUnlinkNode(pxVar5);
        xmlFreeNode(pxVar5);
        return;
      }
      if ((atts != (xmlChar **)0x0) && (pxVar7 = *atts, pxVar7 != (xmlChar *)0x0)) {
        ppxVar10 = atts + 1;
        local_98 = (xmlValidCtxtPtr)((long)ctx + 0xa0);
        do {
          pxVar6 = *ppxVar10;
          attr = (_xmlNode *)
                 xmlNewNsProp(*(xmlNodePtr *)((long)ctx + 0x50),(xmlNsPtr)0x0,pxVar7,(xmlChar *)0x0)
          ;
          if (attr == (_xmlNode *)0x0) {
LAB_00147ce4:
            xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
          }
          else {
            if (pxVar6 == (xmlChar *)0x0) {
              iVar3 = htmlIsBooleanAttr(pxVar7);
              if (iVar3 == 0) {
                pxVar7 = (xmlChar *)0x0;
                pxVar6 = (xmlChar *)0x0;
              }
              else {
                pxVar6 = xmlStrdup(pxVar7);
                pxVar7 = pxVar6;
                if (pxVar6 == (xmlChar *)0x0) goto LAB_00147ce4;
              }
            }
            else {
              pxVar7 = (xmlChar *)0x0;
            }
            if (pxVar6 != (xmlChar *)0x0) {
              pxVar5 = xmlNewDocText(*(xmlDoc **)((long)ctx + 0x10),pxVar6);
              attr->children = pxVar5;
              if (pxVar5 == (xmlNodePtr)0x0) {
                xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
              }
              else {
                attr->last = pxVar5;
                pxVar5->parent = attr;
              }
            }
            if (((((*(byte *)((long)ctx + 0x1b0) & 8) == 0) &&
                 (p_Var1 = attr->children, p_Var1 != (_xmlNode *)0x0)) &&
                (p_Var1->type == XML_TEXT_NODE)) && (p_Var1->next == (_xmlNode *)0x0)) {
              iVar3 = xmlIsID(*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),
                              (xmlAttrPtr)attr);
              if (iVar3 < 0) {
                xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
              }
              else if (iVar3 != 0) {
                xmlAddID(local_98,*(xmlDocPtr *)((long)ctx + 0x10),attr->children->content,
                         (xmlAttrPtr)attr);
              }
            }
            if (pxVar7 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar7);
            }
          }
          pxVar7 = ppxVar10[1];
          ppxVar10 = ppxVar10 + 2;
        } while (pxVar7 != (xmlChar *)0x0);
      }
    }
  }
  return;
}

Assistant:

void
xmlSAX2StartElement(void *ctx, const xmlChar *fullname, const xmlChar **atts) {
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    (void) atts;

    if ((ctxt == NULL) || (fullname == NULL) || (ctxt->myDoc == NULL))
        return;

#ifdef LIBXML_SAX1_ENABLED
    if (!ctxt->html) {
        xmlSAX1StartElement(ctxt, fullname, atts);
        return;
    }
#endif

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
        xmlSAX2StartHtmlElement(ctxt, fullname, atts);
        return;
    }
#endif
}